

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O3

int mriStep_AccessStepMem(ARKodeMem ark_mem,char *fname,ARKodeMRIStepMem *step_mem)

{
  int iVar1;
  
  if ((ARKodeMRIStepMem)ark_mem->step_mem == (ARKodeMRIStepMem)0x0) {
    iVar1 = -0x15;
    arkProcessError(ark_mem,-0x15,0xc0f,fname,
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    *step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mriStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                          ARKodeMRIStepMem* step_mem)
{
  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
  return (ARK_SUCCESS);
}